

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  j_compress_ptr in_RSI;
  long in_RDI;
  int m;
  int v2;
  int v;
  int ke;
  int k;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr entropy;
  int local_40;
  int local_3c;
  int local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  jpeg_error_mgr *pjVar3;
  uchar *st_00;
  
  st_00 = *(uchar **)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(st_00 + 0x60) == 0) {
      emit_restart((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      *(undefined4 *)(st_00 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(st_00 + 100) = *(int *)(st_00 + 100) + 1;
      *(uint *)(st_00 + 100) = *(uint *)(st_00 + 100) & 7;
    }
    *(int *)(st_00 + 0x60) = *(int *)(st_00 + 0x60) + -1;
  }
  pjVar3 = in_RSI->err;
  for (iVar2 = *(int *)(in_RDI + 0x1a0); 0 < iVar2; iVar2 = iVar2 + -1) {
    iVar1 = (int)*(short *)((long)&pjVar3->error_exit + (long)jpeg_natural_order[iVar2] * 2);
    if (iVar1 < 0) {
      iVar1 = -iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    else {
      iVar1 = iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    if (iVar1 != 0) break;
  }
  iVar1 = *(int *)(in_RDI + 0x19c);
LAB_00174403:
  iVar4 = (int)((ulong)pjVar3 >> 0x20);
  if (iVar2 < iVar1) {
    if (iVar1 <= *(int *)(in_RDI + 0x1a0)) {
      arith_encode(in_RSI,st_00,iVar4);
    }
    return 1;
  }
  arith_encode(in_RSI,st_00,iVar4);
  do {
    local_38 = (int)*(short *)((long)&pjVar3->error_exit + (long)jpeg_natural_order[iVar1] * 2);
    iVar4 = (int)((ulong)pjVar3 >> 0x20);
    if (local_38 < 0) {
      local_38 = -local_38 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (local_38 != 0) break;
    }
    else {
      local_38 = local_38 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (local_38 != 0) {
        arith_encode(in_RSI,st_00,iVar4);
        arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
        goto LAB_0017454a;
      }
    }
    arith_encode(in_RSI,st_00,iVar4);
    iVar1 = iVar1 + 1;
  } while( true );
  arith_encode(in_RSI,st_00,iVar4);
  arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
LAB_0017454a:
  local_40 = 0;
  if (local_38 + -1 != 0) {
    arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
    local_40 = 1;
    local_3c = local_38 + -1 >> 1;
    if (local_3c != 0) {
      arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
      local_40 = 2;
      while (local_3c = local_3c >> 1, local_3c != 0) {
        arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
        local_40 = local_40 << 1;
      }
    }
  }
  arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
  while (local_40 = local_40 >> 1, local_40 != 0) {
    arith_encode(in_RSI,st_00,(int)((ulong)pjVar3 >> 0x20));
  }
  iVar1 = iVar1 + 1;
  goto LAB_00174403;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Figure F.5: Encode_AC_Coefficients */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 0);         /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 0);
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 1);
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
    st += 2;
    /* Figure F.8: Encoding the magnitude category of v */
    m = 0;
    if (v -= 1) {
      arith_encode(cinfo, st, 1);
      m = 1;
      v2 = v;
      if (v2 >>= 1) {
        arith_encode(cinfo, st, 1);
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
    }
    arith_encode(cinfo, st, 0);
    /* Figure F.9: Encoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      arith_encode(cinfo, st, (m & v) ? 1 : 0);
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}